

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvrogencppTests.cc
# Opt level: O2

void testEncoding2<umu::r1>(void)

{
  auto_ptr<avro::OutputStream> os;
  auto_ptr<avro::InputStream> is;
  EncoderPtr e;
  ValidSchema s;
  shared_count local_288;
  DecoderPtr d;
  r1 t2;
  r1 t1;
  ifstream ifs;
  
  avro::ValidSchema::ValidSchema(&s);
  std::ifstream::ifstream(&ifs,"jsonschemas/union_map_union",_S_in);
  avro::compileJsonSchema((istream *)&ifs,&s);
  avro::memoryOutputStream((ulong)&os);
  avro::binaryEncoder();
  avro::validatingEncoder((ValidSchema *)&e,(shared_ptr *)&s);
  boost::detail::shared_count::~shared_count((shared_count *)&t1.id._M_string_length);
  (**(code **)(*(long *)e.px + 0x10))(e.px,_os);
  umu::r1::r1(&t1);
  avro::codec_traits<umu::r1>::encode(e.px,&t1);
  (**(code **)(*(long *)e.px + 0x18))();
  avro::binaryDecoder();
  avro::validatingDecoder((ValidSchema *)&d,(shared_ptr *)&s);
  boost::detail::shared_count::~shared_count((shared_count *)&t2.id._M_string_length);
  avro::memoryInputStream((OutputStream *)&is);
  (**(code **)(*(long *)d.px + 0x10))(d.px,_is);
  umu::r1::r1(&t2);
  avro::codec_traits<umu::r1>::decode(d.px,&t2);
  umu::r1::~r1(&t2);
  if (_is != (long *)0x0) {
    (**(code **)(*_is + 8))();
  }
  boost::detail::shared_count::~shared_count(&d.pn);
  umu::r1::~r1(&t1);
  boost::detail::shared_count::~shared_count(&e.pn);
  if (_os != (long *)0x0) {
    (**(code **)(*_os + 8))();
  }
  std::ifstream::~ifstream(&ifs);
  boost::detail::shared_count::~shared_count(&local_288);
  return;
}

Assistant:

void testEncoding2()
{
    ValidSchema s;
    ifstream ifs(schemaFilename<T>::value);
    compileJsonSchema(ifs, s);

    auto_ptr<OutputStream> os = memoryOutputStream();
    EncoderPtr e = validatingEncoder(s, binaryEncoder());
    e->init(*os);
    T t1;
    setRecord(t1);
    avro::encode(*e, t1);
    e->flush();

    DecoderPtr d = validatingDecoder(s, binaryDecoder());
    auto_ptr<InputStream> is = memoryInputStream(*os);
    d->init(*is);
    T t2;
    avro::decode(*d, t2);

    check(t2, t1);
}